

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void test_then_block(LexState *ls,int *escapelist)

{
  FuncState *fs_00;
  int list;
  int l2;
  int condtrue;
  FuncState *fs;
  int *escapelist_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  luaX_next(ls);
  list = cond(ls);
  checknext(ls,0x112);
  block(ls);
  if (((ls->t).token == 0x103) || ((ls->t).token == 0x104)) {
    l2 = luaK_jump(fs_00);
    luaK_concat(fs_00,escapelist,l2);
  }
  luaK_patchtohere(fs_00,list);
  return;
}

Assistant:

static void test_then_block (LexState *ls, int *escapelist) {
  /* test_then_block -> [IF | ELSEIF] cond THEN block */
  FuncState *fs = ls->fs;
  int condtrue;
  luaX_next(ls);  /* skip IF or ELSEIF */
  condtrue = cond(ls);  /* read condition */
  checknext(ls, TK_THEN);
  block(ls);  /* 'then' part */
  if (ls->t.token == TK_ELSE ||
      ls->t.token == TK_ELSEIF)  /* followed by 'else'/'elseif'? */
    luaK_concat(fs, escapelist, luaK_jump(fs));  /* must jump over it */
  luaK_patchtohere(fs, condtrue);
}